

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessBuffersTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::DirectStateAccess::Buffers::FunctionalTest::CheckTransformFeedbackResult
          (FunctionalTest *this)

{
  int *piVar1;
  int *piVar2;
  int iVar3;
  undefined4 extraout_var;
  long lVar4;
  GLint output_data [7];
  undefined1 local_190 [384];
  
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  output_data[4] = 0;
  output_data[5] = 0;
  output_data[6] = 0;
  output_data[0] = 0;
  output_data[1] = 0;
  output_data[2] = 0;
  output_data[3] = 0;
  (*this->m_pGetNamedBufferSubData)(this->m_bo_out,0,0x1c,output_data);
  iVar3 = (**(code **)(CONCAT44(extraout_var,iVar3) + 0x800))();
  if (iVar3 == 0) {
    lVar4 = 0;
    do {
      if (lVar4 == 0x1c) {
        return true;
      }
      piVar1 = (int *)((long)&s_expected_data + lVar4);
      piVar2 = (int *)((long)output_data + lVar4);
      lVar4 = lVar4 + 4;
    } while (*piVar1 == *piVar2);
    local_190._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_190 + 8));
    std::operator<<((ostream *)(local_190 + 8),"Expected data is not equal to results.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_190,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    local_190._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_190 + 8));
    std::operator<<((ostream *)(local_190 + 8),"GetNamedBufferSubData has failed.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_190,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_190 + 8));
  return false;
}

Assistant:

bool FunctionalTest::CheckTransformFeedbackResult()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Local data storage. */
	glw::GLint output_data[sizeof(s_initial_data_b) / sizeof(s_initial_data_b[0])] = {};

	/* Fetch data. */
	m_pGetNamedBufferSubData(m_bo_out, 0, sizeof(output_data), output_data);

	/* Error checking. */
	if (GL_NO_ERROR == gl.getError())
	{
		for (glw::GLuint i = 0; i < sizeof(s_initial_data_b) / sizeof(s_initial_data_b[0]); ++i)
		{
			if (s_expected_data[i] != output_data[i])
			{
				m_context.getTestContext().getLog() << tcu::TestLog::Message << "Expected data is not equal to results."
													<< tcu::TestLog::EndMessage;
				return false;
			}
		}

		return true;
	}
	else
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message << "GetNamedBufferSubData has failed."
											<< tcu::TestLog::EndMessage;
	}
	return false;
}